

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacMessage.c
# Opt level: O0

HCOSE_RECIPIENT COSE_Mac_GetRecipient(HCOSE_MAC cose,int iRecipient,cose_errback *perr)

{
  _Bool _Var1;
  HCOSE_MAC local_38;
  COSE_RecipientInfo *p;
  int i;
  cose_errback *perr_local;
  int iRecipient_local;
  HCOSE_MAC cose_local;
  
  _Var1 = IsValidMacHandle(cose);
  if (_Var1) {
    local_38 = *(HCOSE_MAC *)(cose + 0x58);
    for (p._4_4_ = 0; p._4_4_ < iRecipient; p._4_4_ = p._4_4_ + 1) {
      if (local_38 == (HCOSE_MAC)0x0) {
        if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_NO_RECIPIENT_FOUND;
        }
        goto LAB_00337b1d;
      }
      local_38 = *(HCOSE_MAC *)(local_38 + 0x70);
    }
    if (local_38 != (HCOSE_MAC)0x0) {
      *(int *)(local_38 + 0x10) = *(int *)(local_38 + 0x10) + 1;
    }
    cose_local = local_38;
  }
  else {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
LAB_00337b1d:
    cose_local = (HCOSE_MAC)0x0;
  }
  return (HCOSE_RECIPIENT)cose_local;
}

Assistant:

HCOSE_RECIPIENT COSE_Mac_GetRecipient(HCOSE_MAC cose, int iRecipient, cose_errback * perr)
{
	int i;
	COSE_RecipientInfo * p;

	CHECK_CONDITION(IsValidMacHandle(cose), COSE_ERR_INVALID_PARAMETER);

	p = ((COSE_MacMessage *)cose)->m_recipientFirst;
	for (i = 0; i < iRecipient; i++) {
		CHECK_CONDITION(p != NULL, COSE_ERR_NO_RECIPIENT_FOUND);
		p = p->m_recipientNext;
	}
	if (p != NULL) p->m_encrypt.m_message.m_refCount++;
	return (HCOSE_RECIPIENT)p;

errorReturn:
	return NULL;
}